

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrlist.h
# Opt level: O1

void __thiscall icu_63::NFRuleList::add(NFRuleList *this,NFRule *thing)

{
  NFRule **ppNVar1;
  uint uVar2;
  
  if (this->fCount == this->fCapacity) {
    uVar2 = this->fCapacity + 10;
    this->fCapacity = uVar2;
    ppNVar1 = (NFRule **)uprv_realloc_63(this->fStuff,(ulong)uVar2 << 3);
    this->fStuff = ppNVar1;
  }
  if (this->fStuff == (NFRule **)0x0) {
    this->fCount = 0;
    this->fCapacity = 0;
  }
  else {
    uVar2 = this->fCount;
    this->fCount = uVar2 + 1;
    this->fStuff[uVar2] = thing;
  }
  return;
}

Assistant:

void add(NFRule* thing) {
        if (fCount == fCapacity) {
            fCapacity += 10;
            fStuff = (NFRule**)uprv_realloc(fStuff, fCapacity * sizeof(NFRule*)); // assume success
        }
        if (fStuff != NULL) {
        	fStuff[fCount++] = thing;
        } else {
        	fCapacity = 0;
        	fCount = 0;
        }
    }